

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall
FIX::UtcTimeStampField::UtcTimeStampField
          (UtcTimeStampField *this,int field,UtcTimeStamp *data,int precision)

{
  string local_48;
  int local_24;
  UtcTimeStamp *pUStack_20;
  int precision_local;
  UtcTimeStamp *data_local;
  UtcTimeStampField *pUStack_10;
  int field_local;
  UtcTimeStampField *this_local;
  
  local_24 = precision;
  pUStack_20 = data;
  data_local._4_4_ = field;
  pUStack_10 = this;
  UtcTimeStampConvertor::convert_abi_cxx11_
            (&local_48,(UtcTimeStampConvertor *)data,(UtcTimeStamp *)(ulong)(uint)precision,
             precision);
  FieldBase::FieldBase(&this->super_FieldBase,field,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__UtcTimeStampField_00504f30;
  return;
}

Assistant:

explicit UtcTimeStampField(int field, const UtcTimeStamp &data, int precision = 0)
      : FieldBase(field, UtcTimeStampConvertor::convert(data, precision)) {}